

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::ItemSimilarityRecommender
          (ItemSimilarityRecommender *this)

{
  ItemSimilarityRecommender *pIVar1;
  ItemSimilarityRecommender *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ItemSimilarityRecommender_00577490;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
  ::RepeatedPtrField(&this->itemitemsimilarities_);
  pIVar1 = internal_default_instance();
  if (this != pIVar1) {
    protobuf_ItemSimilarityRecommender_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

ItemSimilarityRecommender::ItemSimilarityRecommender()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_ItemSimilarityRecommender_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.ItemSimilarityRecommender)
}